

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O3

Token front::word::get_token(string *buf)

{
  int iVar1;
  Token TVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)buf);
  if (iVar1 == 0) {
    TVar2 = CONSTTK;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)buf);
    if (iVar1 == 0) {
      TVar2 = INTTK;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)buf);
      if (iVar1 == 0) {
        TVar2 = VOIDTK;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)buf);
        if (iVar1 == 0) {
          TVar2 = IFTK;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)buf);
          if (iVar1 == 0) {
            TVar2 = ELSETK;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)buf);
            if (iVar1 == 0) {
              TVar2 = WHILETK;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)buf);
              if (iVar1 == 0) {
                TVar2 = BREAK;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)buf);
                if (iVar1 == 0) {
                  TVar2 = CONTINUETK;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)buf);
                  TVar2 = RETURNTK;
                  if (iVar1 != 0) {
                    TVar2 = IDENFR;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

Token front::word::get_token(const string &buf) {
  if (buf == "const") {
    return Token::CONSTTK;
  } else if (buf == "int") {
    return Token::INTTK;
  } else if (buf == "void") {
    return Token::VOIDTK;
  } else if (buf == "if") {
    return Token::IFTK;
  } else if (buf == "else") {
    return Token::ELSETK;
  } else if (buf == "while") {
    return Token::WHILETK;
  } else if (buf == "break") {
    return Token::BREAK;
  } else if (buf == "continue") {
    return Token::CONTINUETK;
  } else if (buf == "return") {
    return Token::RETURNTK;
  } else {
    return Token::IDENFR;
  }
}